

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_bufstr_kfold_cse(jit_State *J)

{
  IRRef1 IVar1;
  IRIns *pIVar2;
  bool bVar3;
  TRef TVar4;
  IRIns *in_RAX;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  IRIns *pIVar8;
  IRIns *pIVar9;
  IROp1 IVar10;
  
  if ((J->flags >> 0x10 & 1) != 0) {
    IVar10 = (J->fold).left[0].field_1.o;
    if (IVar10 == 'V') {
      in_RAX = (J->cur).ir;
      uVar7 = (ulong)(J->fold).left[0].field_0.op1;
      bVar3 = true;
      if ((*(char *)((long)in_RAX + uVar7 * 8 + 5) == 'U') &&
         (*(short *)((long)in_RAX + uVar7 * 8 + 2) == 0)) {
        in_RAX = (IRIns *)(ulong)(J->fold).left[0].field_0.op2;
        bVar3 = false;
      }
      if (!bVar3) {
        return (TRef)in_RAX;
      }
    }
    else if (IVar10 == 'U') {
      if ((J->fold).left[0].field_0.op2 != 0) {
        IVar1 = (J->fold).left[0].field_0.prev;
        (J->fold).ins.field_0.op1 = (J->fold).left[0].field_0.op1;
        (J->fold).ins.field_0.op2 = IVar1;
        TVar4 = lj_opt_cse(J);
        return TVar4;
      }
      TVar4 = lj_ir_kgc(J,(GCobj *)&J[-1].penalty[0x2a].val,IRT_STR);
      return TVar4;
    }
  }
  if ((J->flags >> 0x11 & 1) != 0) {
    uVar6 = (uint)J->chain[0x57];
    do {
      uVar5 = uVar6;
      TVar4 = (TRef)in_RAX;
      if (uVar5 == 0) break;
      pIVar2 = (J->cur).ir;
      IVar10 = (J->fold).left[0].field_1.o;
      if (IVar10 == *(IROp1 *)((long)pIVar2 + (ulong)pIVar2[uVar5].field_0.op1 * 8 + 5)) {
        pIVar8 = pIVar2 + pIVar2[uVar5].field_0.op1;
        pIVar9 = (J->fold).left;
        do {
          IVar1 = (pIVar9->field_0).op2;
          if (IVar1 != (pIVar8->field_0).op2) break;
          if (IVar10 == 'U' && IVar1 == 0) {
            bVar3 = false;
            in_RAX = (IRIns *)(ulong)uVar5;
            uVar6 = uVar5;
            goto LAB_0011a45d;
          }
          if (IVar10 == 'a' && IVar1 == 0x17) break;
          pIVar9 = pIVar2 + (pIVar9->field_0).op1;
          pIVar8 = pIVar2 + (pIVar8->field_0).op1;
          IVar10 = (pIVar9->field_1).o;
        } while (IVar10 == (pIVar8->field_1).o);
      }
      bVar3 = true;
      uVar6 = (uint)*(ushort *)((long)pIVar2 + (ulong)uVar5 * 8 + 6);
LAB_0011a45d:
      TVar4 = (TRef)in_RAX;
    } while (bVar3);
    if (uVar5 != 0) {
      return TVar4;
    }
  }
  TVar4 = lj_ir_emit(J);
  return TVar4;
}

Assistant:

LJFOLD(BUFSTR any any)
LJFOLDF(bufstr_kfold_cse)
{
  lj_assertJ(fleft->o == IR_BUFHDR || fleft->o == IR_BUFPUT ||
	     fleft->o == IR_CALLL,
	     "bad buffer constructor IR op %d", fleft->o);
  if (LJ_LIKELY(J->flags & JIT_F_OPT_FOLD)) {
    if (fleft->o == IR_BUFHDR) {  /* No put operations? */
      if (fleft->op2 == IRBUFHDR_RESET)  /* Empty buffer? */
	return lj_ir_kstr(J, &J2G(J)->strempty);
      fins->op1 = fleft->op1;
      fins->op2 = fleft->prev;  /* Relies on checks in bufput_append. */
      return CSEFOLD;
    } else if (fleft->o == IR_BUFPUT) {
      IRIns *irb = IR(fleft->op1);
      if (irb->o == IR_BUFHDR && irb->op2 == IRBUFHDR_RESET)
	return fleft->op2;  /* Shortcut for a single put operation. */
    }
  }
  /* Try to CSE the whole chain. */
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    IRRef ref = J->chain[IR_BUFSTR];
    while (ref) {
      IRIns *irs = IR(ref), *ira = fleft, *irb = IR(irs->op1);
      while (ira->o == irb->o && ira->op2 == irb->op2) {
	lj_assertJ(ira->o == IR_BUFHDR || ira->o == IR_BUFPUT ||
		   ira->o == IR_CALLL || ira->o == IR_CARG,
		   "bad buffer constructor IR op %d", ira->o);
	if (ira->o == IR_BUFHDR && ira->op2 == IRBUFHDR_RESET)
	  return ref;  /* CSE succeeded. */
	if (ira->o == IR_CALLL && ira->op2 == IRCALL_lj_buf_puttab)
	  break;
	ira = IR(ira->op1);
	irb = IR(irb->op1);
      }
      ref = irs->prev;
    }
  }
  return EMITFOLD;  /* No CSE possible. */
}